

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void unpackforblock30(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  uint32_t *out;
  uint64_t *pw64;
  uint64_t w14;
  uint64_t w13;
  uint64_t w12;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t mask;
  
  puVar1 = (ulong *)*in_RSI;
  piVar2 = (int *)*in_RDX;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  uVar7 = puVar1[4];
  uVar8 = puVar1[5];
  uVar9 = puVar1[6];
  uVar10 = puVar1[7];
  uVar11 = puVar1[8];
  uVar12 = puVar1[9];
  uVar13 = puVar1[10];
  uVar14 = puVar1[0xb];
  uVar15 = puVar1[0xc];
  uVar16 = puVar1[0xd];
  uVar17 = puVar1[0xe];
  *in_RSI = *in_RSI + 0x78;
  *piVar2 = in_EDI + ((uint)uVar3 & 0x3fffffff);
  piVar2[1] = in_EDI + ((uint)(uVar3 >> 0x1e) & 0x3fffffff);
  piVar2[2] = in_EDI + ((uint)(uVar3 >> 0x3c) | (uint)(uVar4 << 4) & 0x3fffffff);
  piVar2[3] = in_EDI + ((uint)(uVar4 >> 0x1a) & 0x3fffffff);
  piVar2[4] = in_EDI + ((uint)(byte)(uVar4 >> 0x38) | (uint)(uVar5 << 8) & 0x3fffffff);
  piVar2[5] = in_EDI + ((uint)(uVar5 >> 0x16) & 0x3fffffff);
  piVar2[6] = in_EDI + ((uint)(uVar5 >> 0x34) | (uint)(uVar6 << 0xc) & 0x3fffffff);
  piVar2[7] = in_EDI + ((uint)(uVar6 >> 0x12) & 0x3fffffff);
  piVar2[8] = in_EDI + ((uint)(ushort)(uVar6 >> 0x30) | (uint)(uVar7 << 0x10) & 0x3fffffff);
  piVar2[9] = in_EDI + ((uint)(uVar7 >> 0xe) & 0x3fffffff);
  piVar2[10] = in_EDI + ((uint)(uVar7 >> 0x2c) | (uint)(uVar8 << 0x14) & 0x3fffffff);
  piVar2[0xb] = in_EDI + ((uint)(uVar8 >> 10) & 0x3fffffff);
  piVar2[0xc] = in_EDI + ((uint)(uVar8 >> 0x28) | (uint)(uVar9 << 0x18) & 0x3fffffff);
  piVar2[0xd] = in_EDI + ((uint)(uVar9 >> 6) & 0x3fffffff);
  piVar2[0xe] = in_EDI + ((uint)(uVar9 >> 0x24) | (uint)(uVar10 << 0x1c) & 0x3fffffff);
  piVar2[0xf] = in_EDI + ((uint)(uVar10 >> 2) & 0x3fffffff);
  uVar18 = (uint)(uVar10 >> 0x20);
  piVar2[0x10] = in_EDI + (uVar18 & 0x3fffffff);
  piVar2[0x11] = in_EDI + (uVar18 >> 0x1e | (uint)(uVar11 << 2) & 0x3fffffff);
  piVar2[0x12] = in_EDI + ((uint)(uVar11 >> 0x1c) & 0x3fffffff);
  piVar2[0x13] = in_EDI + ((uint)(uVar11 >> 0x3a) | (uint)(uVar12 << 6) & 0x3fffffff);
  piVar2[0x14] = in_EDI + ((uint)(uVar12 >> 0x18) & 0x3fffffff);
  piVar2[0x15] = in_EDI + ((uint)(uVar12 >> 0x36) | (uint)(uVar13 << 10) & 0x3fffffff);
  piVar2[0x16] = in_EDI + ((uint)(uVar13 >> 0x14) & 0x3fffffff);
  piVar2[0x17] = in_EDI + ((uint)(uVar13 >> 0x32) | (uint)(uVar14 << 0xe) & 0x3fffffff);
  piVar2[0x18] = in_EDI + ((uint)(uVar14 >> 0x10) & 0x3fffffff);
  piVar2[0x19] = in_EDI + ((uint)(uVar14 >> 0x2e) | (uint)(uVar15 << 0x12) & 0x3fffffff);
  piVar2[0x1a] = in_EDI + ((uint)(uVar15 >> 0xc) & 0x3fffffff);
  piVar2[0x1b] = in_EDI + ((uint)(uVar15 >> 0x2a) | (uint)(uVar16 << 0x16) & 0x3fffffff);
  piVar2[0x1c] = in_EDI + ((uint)(uVar16 >> 8) & 0x3fffffff);
  piVar2[0x1d] = in_EDI + ((uint)(uVar16 >> 0x26) | (uint)(uVar17 << 0x1a) & 0x3fffffff);
  piVar2[0x1e] = in_EDI + ((uint)(uVar17 >> 4) & 0x3fffffff);
  piVar2[0x1f] = in_EDI + (uint)(uVar17 >> 0x22);
  *in_RDX = *in_RDX + 0x80;
  return;
}

Assistant:

static void unpackforblock30(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(1073741823);
  /* we are going to access  15 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  uint64_t w13 = pw64[13];
  uint64_t w14 = pw64[14];
  *pw += 120; /* we used up 120 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 30) & mask);
  out[2] = base + (uint32_t)(((w0 >> 60) | (w1 << 4)) & mask);
  out[3] = base + (uint32_t)((w1 >> 26) & mask);
  out[4] = base + (uint32_t)(((w1 >> 56) | (w2 << 8)) & mask);
  out[5] = base + (uint32_t)((w2 >> 22) & mask);
  out[6] = base + (uint32_t)(((w2 >> 52) | (w3 << 12)) & mask);
  out[7] = base + (uint32_t)((w3 >> 18) & mask);
  out[8] = base + (uint32_t)(((w3 >> 48) | (w4 << 16)) & mask);
  out[9] = base + (uint32_t)((w4 >> 14) & mask);
  out[10] = base + (uint32_t)(((w4 >> 44) | (w5 << 20)) & mask);
  out[11] = base + (uint32_t)((w5 >> 10) & mask);
  out[12] = base + (uint32_t)(((w5 >> 40) | (w6 << 24)) & mask);
  out[13] = base + (uint32_t)((w6 >> 6) & mask);
  out[14] = base + (uint32_t)(((w6 >> 36) | (w7 << 28)) & mask);
  out[15] = base + (uint32_t)((w7 >> 2) & mask);
  out[16] = base + (uint32_t)((w7 >> 32) & mask);
  out[17] = base + (uint32_t)(((w7 >> 62) | (w8 << 2)) & mask);
  out[18] = base + (uint32_t)((w8 >> 28) & mask);
  out[19] = base + (uint32_t)(((w8 >> 58) | (w9 << 6)) & mask);
  out[20] = base + (uint32_t)((w9 >> 24) & mask);
  out[21] = base + (uint32_t)(((w9 >> 54) | (w10 << 10)) & mask);
  out[22] = base + (uint32_t)((w10 >> 20) & mask);
  out[23] = base + (uint32_t)(((w10 >> 50) | (w11 << 14)) & mask);
  out[24] = base + (uint32_t)((w11 >> 16) & mask);
  out[25] = base + (uint32_t)(((w11 >> 46) | (w12 << 18)) & mask);
  out[26] = base + (uint32_t)((w12 >> 12) & mask);
  out[27] = base + (uint32_t)(((w12 >> 42) | (w13 << 22)) & mask);
  out[28] = base + (uint32_t)((w13 >> 8) & mask);
  out[29] = base + (uint32_t)(((w13 >> 38) | (w14 << 26)) & mask);
  out[30] = base + (uint32_t)((w14 >> 4) & mask);
  out[31] = base + (uint32_t)(w14 >> 34);
  *pout += 32; /* we wrote 32 32-bit integers */
}